

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendDecimalValueInternal<duckdb::hugeint_t,int>
          (BaseAppender *this,Vector *col,hugeint_t input)

{
  byte bVar1;
  uint8_t width;
  InternalException *this_00;
  hugeint_t input_00;
  CastParameters parameters;
  uint8_t in_stack_ffffffffffffff98;
  string local_60;
  undefined8 local_40;
  undefined1 local_38;
  
  if (this->appender_type == PHYSICAL) {
    AppendValueInternal<duckdb::hugeint_t,int>(this,col,input);
    return;
  }
  if (this->appender_type == LOGICAL) {
    bVar1 = DecimalType::GetWidth(&col->type);
    width = DecimalType::GetScale(&col->type);
    local_60._M_dataplus._M_p = (pointer)0x0;
    local_60._M_string_length._0_1_ = 0;
    local_60.field_2._M_allocated_capacity = 0;
    local_60.field_2._8_8_ = 0;
    local_40 = 0xffffffffffffffff;
    local_38 = 0;
    input_00.upper = col->data + (this->chunk).count * 4;
    input_00.lower = input.upper;
    TryCastToDecimal::Operation<duckdb::hugeint_t,int>
              ((TryCastToDecimal *)input.lower,input_00,(int32_t *)&local_60,
               (CastParameters *)(ulong)bVar1,width,in_stack_ffffffffffffff98);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Type not implemented for AppenderType","");
  InternalException::InternalException(this_00,&local_60);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendDecimalValueInternal(Vector &col, SRC input) {
	switch (appender_type) {
	case AppenderType::LOGICAL: {
		auto &type = col.GetType();
		D_ASSERT(type.id() == LogicalTypeId::DECIMAL);
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		CastParameters parameters;
		auto &result = FlatVector::GetData<DST>(col)[chunk.size()];
		TryCastToDecimal::Operation<SRC, DST>(input, result, parameters, width, scale);
		return;
	}
	case AppenderType::PHYSICAL: {
		AppendValueInternal<SRC, DST>(col, input);
		return;
	}
	default:
		throw InternalException("Type not implemented for AppenderType");
	}
}